

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall SmallVector_CtorCopy2_Test::TestBody(SmallVector_CtorCopy2_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int>_> matcher;
  initializer_list<int> init;
  bool bVar1;
  char *pcVar2;
  int *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe7c;
  AssertHelper local_150;
  Message local_148;
  int local_13c [4];
  undefined4 local_12c;
  undefined1 local_128 [16];
  _Head_base<2UL,_int,_false> local_118;
  char local_114 [20];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  size_t local_e0;
  uint local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  small_vector<int,_3UL> c;
  undefined1 local_48 [8];
  small_vector<int,_3UL> b;
  SmallVector_CtorCopy2_Test *this_local;
  
  c.buffer_ = (int *)0x500000003;
  init._M_len = 5;
  init._M_array = (iterator)&c.buffer_;
  b.buffer_ = (int *)this;
  pstore::small_vector<int,_3UL>::small_vector((small_vector<int,_3UL> *)local_48,init);
  pstore::small_vector<int,_3UL>::small_vector
            ((small_vector<int,_3UL> *)local_b0,(small_vector<int,_3UL> *)local_48);
  local_d4 = 5;
  local_e0 = pstore::small_vector<int,_3UL>::size((small_vector<int,_3UL> *)local_b0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_d0,"5U","c.size ()",&local_d4,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_12c = 3;
  local_13c[3] = 5;
  local_13c[2] = 7;
  local_13c[1] = 0xb;
  local_13c[0] = 0xd;
  testing::ElementsAre<int,int,int,int,int>
            ((ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int>_> *)local_128,
             (testing *)&local_12c,local_13c + 3,local_13c + 2,local_13c + 1,local_13c,
             in_stack_fffffffffffffe68);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = local_118._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int>.super__Tuple_impl<4UL,_int>.super__Head_base<4UL,_int,_false>.
  _M_head_impl = (_Head_base<4UL,_int,_false>)(_Head_base<4UL,_int,_false>)local_128._8_4_;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = local_128._12_4_
  ;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (int)in_stack_fffffffffffffe7c;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
  super__Head_base<0UL,_int,_false>._M_head_impl = (int)((ulong)in_stack_fffffffffffffe7c >> 0x20);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int>>>
  ::operator()(local_100,local_114,(small_vector<int,_3UL> *)0x2b3ec1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_b0);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_48);
  return;
}

Assistant:

TEST (SmallVector, CtorCopy2) {
    pstore::small_vector<int, 3> const b{3, 5, 7, 11, 13};
    pstore::small_vector<int, 3> c = b;
    EXPECT_EQ (5U, c.size ());
    EXPECT_THAT (c, ::testing::ElementsAre (3, 5, 7, 11, 13));
}